

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlSAXParseFile(void)

{
  int iVar1;
  int iVar2;
  char *val;
  char *val_00;
  htmlSAXHandlerPtr val_01;
  void *val_02;
  htmlDocPtr val_03;
  int local_54;
  int n_userData;
  void *userData;
  int n_sax;
  htmlSAXHandlerPtr sax;
  int n_encoding;
  char *encoding;
  int n_filename;
  char *filename;
  htmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (encoding._4_4_ = 0; (int)encoding._4_4_ < 8; encoding._4_4_ = encoding._4_4_ + 1) {
    for (sax._4_4_ = 0; (int)sax._4_4_ < 4; sax._4_4_ = sax._4_4_ + 1) {
      for (userData._4_4_ = 0; (int)userData._4_4_ < 1; userData._4_4_ = userData._4_4_ + 1) {
        for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_filepath(encoding._4_4_,0);
          val_00 = gen_const_char_ptr(sax._4_4_,1);
          val_01 = gen_htmlSAXHandlerPtr(userData._4_4_,2);
          val_02 = gen_userdata(local_54,3);
          val_03 = (htmlDocPtr)htmlSAXParseFile(val,val_00,val_01,val_02);
          desret_htmlDocPtr(val_03);
          call_tests = call_tests + 1;
          des_filepath(encoding._4_4_,val,0);
          des_const_char_ptr(sax._4_4_,val_00,1);
          des_htmlSAXHandlerPtr(userData._4_4_,val_01,2);
          des_userdata(local_54,val_02,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)encoding._4_4_);
            printf(" %d",(ulong)sax._4_4_);
            printf(" %d",(ulong)userData._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlSAXParseFile(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlDocPtr ret_val;
    const char * filename; /* the filename */
    int n_filename;
    char * encoding; /* a free form C string describing the HTML document encoding, or NULL */
    int n_encoding;
    htmlSAXHandlerPtr sax; /* the SAX handler block */
    int n_sax;
    void * userData; /* if using SAX, this pointer will be provided on callbacks. */
    int n_userData;

    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_sax = 0;n_sax < gen_nb_htmlSAXHandlerPtr;n_sax++) {
    for (n_userData = 0;n_userData < gen_nb_userdata;n_userData++) {
        mem_base = xmlMemBlocks();
        filename = gen_filepath(n_filename, 0);
        encoding = gen_const_char_ptr(n_encoding, 1);
        sax = gen_htmlSAXHandlerPtr(n_sax, 2);
        userData = gen_userdata(n_userData, 3);

        ret_val = htmlSAXParseFile(filename, (const char *)encoding, sax, userData);
        desret_htmlDocPtr(ret_val);
        call_tests++;
        des_filepath(n_filename, filename, 0);
        des_const_char_ptr(n_encoding, (const char *)encoding, 1);
        des_htmlSAXHandlerPtr(n_sax, sax, 2);
        des_userdata(n_userData, userData, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlSAXParseFile",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_filename);
            printf(" %d", n_encoding);
            printf(" %d", n_sax);
            printf(" %d", n_userData);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}